

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::SetupInitial(ChElementShellReissner4 *this,ChSystem *system)

{
  ChVector<double> *v;
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  pointer psVar46;
  element_type *peVar47;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var48;
  element_type *peVar49;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var51;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var52;
  byte bVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ActualDstType actualDst;
  long lVar71;
  ChVector<double> *pCVar72;
  Index outer;
  double *pdVar73;
  double *xi;
  double *xi_00;
  double *extraout_RDX;
  double *xi_01;
  long lVar74;
  ChVector<double> *pCVar75;
  double *xi_02;
  ChVector<double> *extraout_RDX_00;
  long lVar76;
  ActualDstType actualDst_1;
  ChMatrixNM<double,_4,_2> *der_mat;
  double *pdVar77;
  int i;
  ulong uVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined8 uVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  ChVector<double> x_2_1;
  ChVector<double> x_1_1;
  ChMatrixNM<double,_2,_2> xi_i_i;
  ChMatrixNM<double,_4,_2> L_alpha_B_i;
  ChMatrixNM<double,_4,_IDOFS> H;
  ChMatrixNM<double,_12,_4> Perm;
  ChMatrixNM<double,_4,_IDOFS> tmpP;
  ChMatrixNM<double,_4,_4> M_0_Inv;
  ChVector<double> x_2;
  ChVector<double> x_1;
  ChMatrixNM<double,_4,_4> M_0;
  ChVector<double> local_a50;
  ChVector<double> local_a38;
  Matrix<double,_2,_2,_1,_2,_2> local_a20;
  ChVector<double> local_a00;
  undefined1 auStack_9e8 [40];
  ChVector<double> local_9c0;
  undefined8 uStack_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  double dStack_978;
  double dStack_970;
  undefined8 uStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  double dStack_930;
  double dStack_928;
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 uStack_900;
  undefined8 uStack_8f8;
  double local_8f0;
  double local_8e8;
  ChVector<double> local_8c0;
  undefined8 uStack_8a8;
  undefined8 uStack_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  ChVector<double> local_720 [2];
  ulong auStack_6e8 [7];
  ulong auStack_6b0 [7];
  ulong auStack_678 [7];
  undefined1 local_640 [128];
  undefined1 local_5c0 [8];
  undefined1 auStack_5b8 [16];
  double dStack_5a8;
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_400 [64];
  ChVector<double> local_3c0;
  undefined1 auStack_3a8 [40];
  long alStack_360 [76];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  SetAsNeutral(this);
  ComputeInitialNodeOrientation(this);
  dVar3 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar4 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar5 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar6 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar7 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  dVar8 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar58 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  v = this->xa;
  lVar71 = 0x2dc0;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar3;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar4;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar5;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar6;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar7;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar8;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar58;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  dVar3 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar4 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar5 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar6 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar7 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  dVar8 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar58 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar3;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar4;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar5;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar6;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar7;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar8;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar58;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  dVar6 = this->xa[0].m_data[0];
  dVar7 = this->xa[0].m_data[1];
  dVar8 = this->xa[0].m_data[2];
  dVar58 = this->xa[1].m_data[0];
  dVar59 = this->xa[1].m_data[1];
  dVar60 = this->xa[1].m_data[2];
  dVar61 = this->xa[2].m_data[0];
  dVar62 = this->xa[2].m_data[1];
  dVar3 = this->xa[3].m_data[0];
  dVar4 = this->xa[3].m_data[1];
  dVar5 = this->xa[3].m_data[2];
  this->xa_0[2].m_data[2] = this->xa[2].m_data[2];
  this->xa_0[3].m_data[0] = dVar3;
  this->xa_0[3].m_data[1] = dVar4;
  this->xa_0[3].m_data[2] = dVar5;
  this->xa_0[0].m_data[0] = dVar6;
  this->xa_0[0].m_data[1] = dVar7;
  this->xa_0[0].m_data[2] = dVar8;
  this->xa_0[1].m_data[0] = dVar58;
  this->xa_0[1].m_data[1] = dVar59;
  this->xa_0[1].m_data[2] = dVar60;
  this->xa_0[2].m_data[0] = dVar61;
  this->xa_0[2].m_data[1] = dVar62;
  do {
    puVar1 = (undefined8 *)((long)this + lVar71 + -0x40);
    uVar103 = puVar1[1];
    uVar63 = puVar1[2];
    uVar64 = puVar1[3];
    uVar65 = puVar1[4];
    uVar66 = puVar1[5];
    uVar67 = puVar1[6];
    uVar68 = puVar1[7];
    puVar2 = (undefined8 *)((long)this + lVar71 + -0x2c8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar103;
    puVar2[2] = uVar63;
    puVar2[3] = uVar64;
    puVar2[4] = uVar65;
    puVar2[5] = uVar66;
    puVar2[6] = uVar67;
    puVar2[7] = uVar68;
    *(undefined8 *)((long)this + lVar71 + -0x288) =
         *(undefined8 *)
          ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + lVar71);
    lVar71 = lVar71 + 0x48;
  } while (lVar71 != 12000);
  lVar71 = 12000;
  do {
    puVar1 = (undefined8 *)((long)this + lVar71 + -0x40);
    uVar103 = puVar1[1];
    uVar63 = puVar1[2];
    uVar64 = puVar1[3];
    uVar65 = puVar1[4];
    uVar66 = puVar1[5];
    uVar67 = puVar1[6];
    uVar68 = puVar1[7];
    puVar2 = (undefined8 *)((long)this + lVar71 + -0x2c8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar103;
    puVar2[2] = uVar63;
    puVar2[3] = uVar64;
    puVar2[4] = uVar65;
    puVar2[5] = uVar66;
    puVar2[6] = uVar67;
    puVar2[7] = uVar68;
    *(undefined8 *)((long)this + lVar71 + -0x288) =
         *(undefined8 *)
          ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + lVar71);
    lVar71 = lVar71 + 0x48;
  } while (lVar71 != 0x3000);
  InterpDeriv_xi1(&local_3c0,v,xi);
  InterpDeriv_xi2((ChVector<double> *)local_5c0,v,xi_00);
  auVar55._8_8_ = local_3c0.m_data[2];
  auVar55._0_8_ = local_3c0.m_data[1];
  auVar57 = vpermpd_avx2(*(undefined1 (*) [32])
                          ((this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array + 3),0x50);
  auVar56._8_8_ = local_3c0.m_data[1];
  auVar56._0_8_ = local_3c0.m_data[0];
  auVar167 = vpermpd_avx2(*(undefined1 (*) [32])
                           (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data.array,0x50);
  auVar170 = vpermpd_avx2(*(undefined1 (*) [32])
                           ((this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 6),0x50);
  local_8c0.m_data[0] = (double)local_100;
  auVar55 = vmovhpd_avx(auVar55,auStack_5b8._0_8_);
  auVar56 = vmovhpd_avx(auVar56,local_5c0);
  auVar171 = vpermpd_avx2(ZEXT1632(auVar55),0x44);
  auVar80 = vpermpd_avx2(ZEXT1632(auVar56),0x44);
  auVar79._0_8_ = auVar57._0_8_ * auVar171._0_8_;
  auVar79._8_8_ = auVar57._8_8_ * auVar171._8_8_;
  auVar79._16_8_ = auVar57._16_8_ * auVar171._16_8_;
  auVar79._24_8_ = auVar57._24_8_ * auVar171._24_8_;
  auVar56 = vfmadd213pd_fma(auVar80,auVar167,auVar79);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = local_3c0.m_data[2];
  auVar55 = vmovhpd_avx(auVar104,auStack_5b8._8_8_);
  auVar57 = vpermpd_avx2(ZEXT1632(auVar55),0x44);
  auVar104 = vfmadd213pd_fma(auVar57,auVar170,ZEXT1632(auVar56));
  auVar55 = vshufpd_avx(auVar104,auVar104,1);
  auVar88 = vpermpd_avx512f(_DAT_009b72c0,ZEXT1664(auVar104));
  *(undefined1 (*) [32])
   (this->S_alpha_beta_0).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.
   m_data.array = ZEXT1632(auVar104);
  auVar89 = _DAT_009b7300;
  auVar56 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
  auVar57 = vpermpd_avx2(ZEXT1632(auVar104),0x1e);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = auVar55._0_8_ * 0.0;
  auVar55 = vfmsub231sd_fma(auVar136,auVar104,auVar56);
  this->alpha_0 = auVar55._0_8_;
  auVar89 = vpermpd_avx512f(auVar89,ZEXT1664(auVar104));
  local_100 = vmulpd_avx512f(auVar88,auVar89);
  local_c0 = vpermpd_avx512f(_DAT_009b7340,
                             ZEXT3264(CONCAT824(auVar57._24_8_ * 0.0,
                                                CONCAT816(auVar57._16_8_ * 0.0,
                                                          CONCAT88(auVar104._8_8_ * auVar57._8_8_,
                                                                   auVar104._0_8_ * auVar57._0_8_)))
                                     ));
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_4,_4,_1,_4,_4> *)local_640,(SrcXprType *)&local_8c0,
        (assign_op<double,_double> *)&local_9c0);
  auVar89 = vpbroadcastq_avx512f();
  lVar71 = 0;
  local_400 = vmovdqa64_avx512f(auVar89);
  pdVar73 = extraout_RDX;
  do {
    pdVar77 = (double *)(&xi_i + lVar71 * 2);
    InterpDeriv_xi1(&local_a38,v,pdVar73);
    pCVar75 = &local_3c0;
    InterpDeriv_xi2(&local_a50,v,xi_01);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = local_a38.m_data[0];
    auVar150._8_8_ = 0;
    auVar150._0_8_ = local_a38.m_data[2];
    local_3c0.m_data[0] = (double)(this->S_alpha_beta_i + lVar71);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar137._8_8_ = 0;
    auVar137._0_8_ =
         local_a38.m_data[1] *
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar55 = vfmadd231sd_fma(auVar137,auVar105,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar55 = vfmadd231sd_fma(auVar55,auVar150,auVar10);
    this->S_alpha_beta_i[lVar71].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[0] = auVar55._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar123._8_8_ = 0;
    auVar123._0_8_ =
         local_a38.m_data[1] *
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar56 = vfmadd231sd_fma(auVar123,auVar105,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar56 = vfmadd231sd_fma(auVar56,auVar150,auVar12);
    this->S_alpha_beta_i[lVar71].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[2] = auVar56._0_8_;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = local_a50.m_data[0];
    auVar168._8_8_ = 0;
    auVar168._0_8_ = local_a50.m_data[2];
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar162._8_8_ = 0;
    auVar162._0_8_ =
         local_a50.m_data[1] *
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar104 = vfmadd231sd_fma(auVar162,auVar106,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar104 = vfmadd231sd_fma(auVar104,auVar168,auVar14);
    this->S_alpha_beta_i[lVar71].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[1] = auVar104._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar151._8_8_ = 0;
    auVar151._0_8_ =
         local_a50.m_data[1] *
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar136 = vfmadd231sd_fma(auVar151,auVar106,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         this->T_0_i[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar136 = vfmadd231sd_fma(auVar136,auVar168,auVar16);
    auVar107._8_8_ = 0;
    auVar107._0_8_ = auVar56._0_8_ * auVar104._0_8_;
    auVar55 = vfmsub231sd_fma(auVar107,auVar55,auVar136);
    this->S_alpha_beta_i[lVar71].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[3] = auVar136._0_8_;
    this->alpha_i[lVar71] = auVar55._0_8_;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_2,_2,_1,_2,_2>,_Eigen::Inverse<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_a20,(SrcXprType *)pCVar75,(assign_op<double,_double> *)local_5c0);
    lVar76 = 8;
    do {
      uVar103 = (**(code **)(&UNK_00b391d8 + lVar76))(pdVar77);
      *(undefined8 *)((long)local_a00.m_data + lVar76 + -8) = uVar103;
      uVar103 = (**(code **)((long)&LI_J + lVar76))(pdVar77);
      *(undefined8 *)((long)local_a00.m_data + lVar76) = uVar103;
      lVar76 = lVar76 + 0x10;
    } while (lVar76 != 0x48);
    auVar69._8_8_ =
         local_a20.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[1];
    auVar69._0_8_ =
         local_a20.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[0];
    auVar89._8_8_ = local_a00.m_data[1];
    auVar89._0_8_ = local_a00.m_data[0];
    auVar89._16_8_ = local_a00.m_data[2];
    auVar89._24_40_ = auStack_9e8;
    auVar70._8_8_ =
         local_a20.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[2];
    auVar70._0_8_ =
         local_a20.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[1];
    auVar88 = vbroadcastf32x4_avx512f(auVar70);
    auVar55 = vmovhpd_avx(auVar69,local_a20.
                                  super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
                                  m_storage.m_data.array[3]);
    auVar88 = vmulpd_avx512f(auVar89,auVar88);
    auVar90 = vshuff64x2_avx512f(ZEXT1664(auVar55),ZEXT1664(auVar55),0);
    auVar89 = vmulpd_avx512f(auVar89,auVar90);
    auVar88 = vshufpd_avx512f(auVar88,auVar88,0x55);
    auVar89 = vaddpd_avx512f(auVar88,auVar89);
    *(undefined1 (*) [64])
     this->L_alpha_beta_i[lVar71].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.
     m_storage.m_data.array = auVar89;
    local_940 = 0;
    uStack_938 = 0;
    local_8c0.m_data[1] = 0.0;
    local_8c0.m_data[2] = 0.0;
    uStack_8a8 = 0;
    uStack_8a0 = 0;
    uStack_898 = 0;
    uStack_888 = 0;
    local_9c0.m_data[2] = 0.0;
    uStack_9a8 = 0;
    uStack_9a0 = 0;
    uStack_998 = 0;
    uStack_990 = 0;
    uStack_988 = 0;
    local_980 = 0;
    uStack_968 = 0;
    uStack_960 = 0;
    uStack_958 = 0;
    uStack_950 = 0;
    uStack_948 = 0;
    uStack_920 = 0;
    uStack_918 = 0;
    uStack_910 = 0;
    uStack_908 = 0;
    uStack_900 = 0;
    uStack_8f8 = 0;
    local_880 = 0;
    uStack_878 = 0;
    uStack_870 = 0;
    uStack_868 = 0;
    uStack_860 = 0;
    uStack_858 = 0;
    uStack_850 = 0;
    local_840 = 0;
    uStack_830 = 0;
    uStack_828 = 0;
    uStack_820 = 0;
    uStack_818 = 0;
    uStack_810 = 0;
    uStack_808 = 0;
    local_780 = 0;
    uStack_778 = 0;
    uStack_770 = 0;
    uStack_768 = 0;
    uStack_760 = 0;
    uStack_758 = 0;
    uStack_750 = 0;
    uStack_748 = 0;
    local_7c0 = 0;
    uStack_7b8 = 0;
    uStack_7b0 = 0;
    uStack_7a8 = 0;
    uStack_7a0 = 0;
    uStack_798 = 0;
    uStack_790 = 0;
    uStack_788 = 0;
    local_800 = 0;
    uStack_7f8 = 0;
    uStack_7f0 = 0;
    uStack_7e8 = 0;
    uStack_7e0 = 0;
    uStack_7d8 = 0;
    uStack_7d0 = 0;
    uStack_7c8 = 0;
    pdVar73 = local_720[0].m_data;
    local_9c0.m_data[0] = *pdVar77;
    dStack_978 = (double)(&DAT_00b6ac48)[lVar71 * 2];
    local_8c0.m_data[0] = 1.0;
    uStack_890 = 0x3ff0000000000000;
    uStack_848 = 0x3ff0000000000000;
    uStack_838 = 0x3ff0000000000000;
    local_9c0.m_data[1] = local_9c0.m_data[0] * dStack_978;
    auVar88._0_40_ = ZEXT1640(ZEXT816(0));
    auVar88._40_8_ = local_9c0.m_data[1];
    auVar88._48_8_ = dStack_978;
    auVar88._56_8_ = 0;
    lVar76 = 0xc;
    do {
      uVar78 = auStack_6b0[lVar76 + 2];
      auVar90._8_8_ = uVar78;
      auVar90._0_8_ = uVar78;
      auVar90._16_8_ = uVar78;
      auVar90._24_8_ = uVar78;
      auVar90._32_8_ = uVar78;
      auVar90._40_8_ = uVar78;
      auVar90._48_8_ = uVar78;
      auVar90._56_8_ = uVar78;
      auVar89 = vmulpd_avx512f(ZEXT1664(CONCAT88(local_9c0.m_data[1],local_9c0.m_data[0])),auVar90);
      uVar78 = auStack_6b0[lVar76 + 6];
      auVar91._8_8_ = uVar78;
      auVar91._0_8_ = uVar78;
      auVar91._16_8_ = uVar78;
      auVar91._24_8_ = uVar78;
      auVar91._32_8_ = uVar78;
      auVar91._40_8_ = uVar78;
      auVar91._48_8_ = uVar78;
      auVar91._56_8_ = uVar78;
      auVar90 = vmulpd_avx512f(ZEXT3264(CONCAT824(local_9c0.m_data[1],
                                                  CONCAT816(dStack_978,ZEXT816(0)))),auVar91);
      uVar103 = *(undefined8 *)(local_640 + lVar76 * 8 + -0x20);
      auVar92._8_8_ = uVar103;
      auVar92._0_8_ = uVar103;
      auVar92._16_8_ = uVar103;
      auVar92._24_8_ = uVar103;
      auVar92._32_8_ = uVar103;
      auVar92._40_8_ = uVar103;
      auVar92._48_8_ = uVar103;
      auVar92._56_8_ = uVar103;
      auVar91 = vmulpd_avx512f(ZEXT4864(CONCAT840(local_9c0.m_data[1],
                                                  CONCAT832(local_9c0.m_data[0],ZEXT1632(ZEXT816(0))
                                                           ))),auVar92);
      uVar103 = *(undefined8 *)(local_640 + lVar76 * 8);
      auVar93._8_8_ = uVar103;
      auVar93._0_8_ = uVar103;
      auVar93._16_8_ = uVar103;
      auVar93._24_8_ = uVar103;
      auVar93._32_8_ = uVar103;
      auVar93._40_8_ = uVar103;
      auVar93._48_8_ = uVar103;
      auVar93._56_8_ = uVar103;
      auVar92 = vmulpd_avx512f(auVar88,auVar93);
      lVar76 = lVar76 + 1;
      auVar89 = vaddpd_avx512f(auVar89,auVar90);
      auVar90 = vaddpd_avx512f(auVar91,auVar92);
      auVar89 = vaddpd_avx512f(auVar89,auVar90);
      dVar3 = pdVar73[7];
      *pdVar73 = (double)auVar89._0_8_;
      pdVar73[1] = auVar89._8_8_;
      pdVar73[2] = auVar89._16_8_;
      ((ChVector<double> *)(pdVar73 + 3))->m_data[0] = auVar89._24_8_;
      pdVar73[4] = auVar89._32_8_;
      pdVar73[5] = auVar89._40_8_;
      ((ChVector<double> *)(pdVar73 + 6))->m_data[0] = auVar89._48_8_;
      pdVar73[7] = dVar3;
      pdVar73 = pdVar73 + 7;
    } while (lVar76 != 0x10);
    auVar89 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar88 = vpbroadcastq_avx512f(ZEXT816(0xc));
    auVar90 = vmovdqa64_avx512f(local_400);
    auVar91 = vpbroadcastq_avx512f(ZEXT816(8));
    lVar76 = 0;
    pCVar72 = &local_3c0;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = this->alpha_0 / this->alpha_i[lVar71];
    auVar92 = vbroadcastsd_avx512f(auVar17);
    auVar94._48_8_ = 0x3ff0000000000000;
    auVar94._0_48_ = ZEXT1648(ZEXT816(0x3ff0000000000000));
    auVar94._56_8_ = 0;
    _local_5c0 = vmulpd_avx512f(auVar92,auVar94);
    auVar95._56_8_ = 0x3ff0000000000000;
    auVar95._0_56_ = ZEXT1656(ZEXT816(0));
    local_580 = vmulpd_avx512f(auVar92,auVar95);
    local_540 = vmulpd_avx512f(auVar92,ZEXT1664(ZEXT816(0x3ff0000000000000) << 0x40));
    local_500 = vmulpd_avx512f(auVar92,ZEXT1664(ZEXT816(0)));
    local_4c0 = vmulpd_avx512f(auVar92,ZEXT1664(ZEXT816(0)));
    local_480 = vmulpd_avx512f(auVar92,ZEXT1664(ZEXT816(0)));
    do {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_720[0].m_data[lVar76];
      auVar92 = vbroadcastsd_avx512f(auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = auStack_6e8[lVar76];
      auVar93 = vbroadcastsd_avx512f(auVar19);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auStack_6b0[lVar76];
      auVar94 = vbroadcastsd_avx512f(auVar20);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = auStack_6b0[lVar76 + 7];
      auVar95 = vbroadcastsd_avx512f(auVar21);
      lVar74 = 0;
      auVar96 = vmovdqa64_avx512f(auVar89);
      do {
        uVar78 = vpcmpuq_avx512f(auVar96,auVar88,1);
        auVar97 = vpsllq_avx512f(auVar96,5);
        auVar96 = vpaddq_avx512f(auVar96,auVar91);
        vpaddq_avx512f(auVar90,auVar97);
        auVar97 = vgatherqpd_avx512f(*(undefined8 *)
                                      ((assign_op<double,_double> *)local_5c0 +
                                      (long)&stack0xfffffffffffffff8));
        bVar53 = (byte)uVar78;
        auVar98._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * auVar97._8_8_;
        auVar98._0_8_ = (ulong)(bVar53 & 1) * auVar97._0_8_;
        auVar98._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * auVar97._16_8_;
        auVar98._24_8_ = (ulong)((byte)(uVar78 >> 3) & 1) * auVar97._24_8_;
        auVar98._32_8_ = (ulong)((byte)(uVar78 >> 4) & 1) * auVar97._32_8_;
        auVar98._40_8_ = (ulong)((byte)(uVar78 >> 5) & 1) * auVar97._40_8_;
        auVar98._48_8_ = (ulong)((byte)(uVar78 >> 6) & 1) * auVar97._48_8_;
        auVar98._56_8_ = (uVar78 >> 7) * auVar97._56_8_;
        auVar97 = vmulpd_avx512f(auVar92,auVar98);
        auVar98 = vgatherqpd_avx512f(pCVar75->m_data[1]);
        auVar101._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * auVar98._8_8_;
        auVar101._0_8_ = (ulong)(bVar53 & 1) * auVar98._0_8_;
        auVar101._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * auVar98._16_8_;
        auVar101._24_8_ = (ulong)((byte)(uVar78 >> 3) & 1) * auVar98._24_8_;
        auVar101._32_8_ = (ulong)((byte)(uVar78 >> 4) & 1) * auVar98._32_8_;
        auVar101._40_8_ = (ulong)((byte)(uVar78 >> 5) & 1) * auVar98._40_8_;
        auVar101._48_8_ = (ulong)((byte)(uVar78 >> 6) & 1) * auVar98._48_8_;
        auVar101._56_8_ = (uVar78 >> 7) * auVar98._56_8_;
        auVar98 = vmulpd_avx512f(auVar93,auVar101);
        auVar97 = vaddpd_avx512f(auVar97,auVar98);
        auVar98 = vgatherqpd_avx512f(pCVar75->m_data[2]);
        auVar99._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * auVar98._8_8_;
        auVar99._0_8_ = (ulong)(bVar53 & 1) * auVar98._0_8_;
        auVar99._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * auVar98._16_8_;
        auVar99._24_8_ = (ulong)((byte)(uVar78 >> 3) & 1) * auVar98._24_8_;
        auVar99._32_8_ = (ulong)((byte)(uVar78 >> 4) & 1) * auVar98._32_8_;
        auVar99._40_8_ = (ulong)((byte)(uVar78 >> 5) & 1) * auVar98._40_8_;
        auVar99._48_8_ = (ulong)((byte)(uVar78 >> 6) & 1) * auVar98._48_8_;
        auVar99._56_8_ = (uVar78 >> 7) * auVar98._56_8_;
        auVar98 = vgatherqpd_avx512f((XprTypeNested)pCVar75[1].m_data[0]);
        auVar100._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * auVar98._8_8_;
        auVar100._0_8_ = (ulong)(bVar53 & 1) * auVar98._0_8_;
        auVar100._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * auVar98._16_8_;
        auVar100._24_8_ = (ulong)((byte)(uVar78 >> 3) & 1) * auVar98._24_8_;
        auVar100._32_8_ = (ulong)((byte)(uVar78 >> 4) & 1) * auVar98._32_8_;
        auVar100._40_8_ = (ulong)((byte)(uVar78 >> 5) & 1) * auVar98._40_8_;
        auVar100._48_8_ = (ulong)((byte)(uVar78 >> 6) & 1) * auVar98._48_8_;
        auVar100._56_8_ = (uVar78 >> 7) * auVar98._56_8_;
        auVar98 = vmulpd_avx512f(auVar94,auVar99);
        auVar101 = vmulpd_avx512f(auVar95,auVar100);
        auVar98 = vaddpd_avx512f(auVar98,auVar101);
        auVar97 = vaddpd_avx512f(auVar97,auVar98);
        pdVar73 = pCVar72->m_data + lVar74;
        auVar102._0_8_ =
             (ulong)(bVar53 & 1) * auVar97._0_8_ | (ulong)!(bool)(bVar53 & 1) * (long)*pdVar73;
        bVar54 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar102._8_8_ = (ulong)bVar54 * auVar97._8_8_ | (ulong)!bVar54 * (long)pdVar73[1];
        bVar54 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar102._16_8_ = (ulong)bVar54 * auVar97._16_8_ | (ulong)!bVar54 * (long)pdVar73[2];
        bVar54 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar102._24_8_ = (ulong)bVar54 * auVar97._24_8_ | (ulong)!bVar54 * (long)pdVar73[3];
        bVar54 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar102._32_8_ = (ulong)bVar54 * auVar97._32_8_ | (ulong)!bVar54 * (long)pdVar73[4];
        bVar54 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar102._40_8_ = (ulong)bVar54 * auVar97._40_8_ | (ulong)!bVar54 * (long)pdVar73[5];
        bVar54 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar102._48_8_ = (ulong)bVar54 * auVar97._48_8_ | (ulong)!bVar54 * (long)pdVar73[6];
        auVar102._56_8_ =
             (uVar78 >> 7) * auVar97._56_8_ | (ulong)!SUB81(uVar78 >> 7,0) * (long)pdVar73[7];
        *(undefined1 (*) [64])pdVar73 = auVar102;
        lVar74 = lVar74 + 8;
      } while (lVar74 != 0x10);
      lVar76 = lVar76 + 1;
      pCVar72 = pCVar72 + 4;
    } while (lVar76 != 7);
    auVar57 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar167._8_8_ = 0xc;
    auVar167._0_8_ = 0xc;
    auVar167._16_8_ = 0xc;
    auVar167._24_8_ = 0xc;
    auVar170._8_8_ = 0x38;
    auVar170._0_8_ = 0x38;
    auVar170._16_8_ = 0x38;
    auVar170._24_8_ = 0x38;
    auVar171._8_8_ = 4;
    auVar171._0_8_ = 4;
    auVar171._16_8_ = 4;
    auVar171._24_8_ = 4;
    lVar76 = 0;
    do {
      uVar78 = vpcmpuq_avx512vl(auVar57,auVar167,1);
      uVar78 = uVar78 & 0xf;
      auVar79 = vpmullq_avx512vl(auVar57,auVar170);
      auVar80 = vpbroadcastq_avx512vl();
      auVar57 = vpaddq_avx2(auVar57,auVar171);
      bVar53 = (byte)uVar78;
      auVar81._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * (long)local_3c0.m_data[lVar76 + 1];
      auVar81._0_8_ = (ulong)(bVar53 & 1) * (long)local_3c0.m_data[lVar76];
      auVar81._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * *(long *)(auStack_3a8 + lVar76 * 8 + -8);
      auVar81._24_8_ = (uVar78 >> 3) * *(long *)(auStack_3a8 + lVar76 * 8);
      auVar80 = vpaddq_avx2(auVar80,auVar79);
      vscatterqpd_avx512vl(ZEXT832(this->P_i + lVar71) + auVar79,uVar78,auVar81);
      auVar82._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * alStack_360[lVar76 + 1];
      auVar82._0_8_ = (ulong)(bVar53 & 1) * alStack_360[lVar76];
      auVar82._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * alStack_360[lVar76 + 2];
      auVar82._24_8_ = (uVar78 >> 3) * alStack_360[lVar76 + 3];
      vscatterqpd_avx512vl(ZEXT832(8) + auVar80,uVar78,auVar82);
      auVar83._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * alStack_360[lVar76 + 0xd];
      auVar83._0_8_ = (ulong)(bVar53 & 1) * alStack_360[lVar76 + 0xc];
      auVar83._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * alStack_360[lVar76 + 0xe];
      auVar83._24_8_ = (uVar78 >> 3) * alStack_360[lVar76 + 0xf];
      vscatterqpd_avx512vl(ZEXT832(0x10) + auVar80,uVar78,auVar83);
      auVar84._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * alStack_360[lVar76 + 0x19];
      auVar84._0_8_ = (ulong)(bVar53 & 1) * alStack_360[lVar76 + 0x18];
      auVar84._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * alStack_360[lVar76 + 0x1a];
      auVar84._24_8_ = (uVar78 >> 3) * alStack_360[lVar76 + 0x1b];
      vscatterqpd_avx512vl(ZEXT832(0x18) + auVar80,uVar78,auVar84);
      auVar85._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * alStack_360[lVar76 + 0x25];
      auVar85._0_8_ = (ulong)(bVar53 & 1) * alStack_360[lVar76 + 0x24];
      auVar85._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * alStack_360[lVar76 + 0x26];
      auVar85._24_8_ = (uVar78 >> 3) * alStack_360[lVar76 + 0x27];
      vscatterqpd_avx512vl(ZEXT832(0x20) + auVar80,uVar78,auVar85);
      auVar86._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * alStack_360[lVar76 + 0x31];
      auVar86._0_8_ = (ulong)(bVar53 & 1) * alStack_360[lVar76 + 0x30];
      auVar86._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * alStack_360[lVar76 + 0x32];
      auVar86._24_8_ = (uVar78 >> 3) * alStack_360[lVar76 + 0x33];
      vscatterqpd_avx512vl(ZEXT832(0x28) + auVar80,uVar78,auVar86);
      auVar87._8_8_ = (ulong)((byte)(uVar78 >> 1) & 1) * alStack_360[lVar76 + 0x3d];
      auVar87._0_8_ = (ulong)(bVar53 & 1) * alStack_360[lVar76 + 0x3c];
      auVar87._16_8_ = (ulong)((byte)(uVar78 >> 2) & 1) * alStack_360[lVar76 + 0x3e];
      auVar87._24_8_ = (uVar78 >> 3) * alStack_360[lVar76 + 0x3f];
      lVar76 = lVar76 + 4;
      vscatterqpd_avx512vl(ZEXT832(0x30) + auVar80,uVar78,auVar87);
    } while (lVar76 != 0xc);
    lVar71 = lVar71 + 1;
    pdVar73 = (double *)0x10;
    dStack_970 = local_9c0.m_data[1];
    dStack_930 = local_9c0.m_data[0];
    dStack_928 = local_9c0.m_data[1];
    local_8f0 = local_9c0.m_data[1];
    local_8e8 = dStack_978;
  } while (lVar71 != 4);
  ComputeIPCurvature(this);
  lVar71 = -0x60;
  lVar74 = 0x2dc0;
  lVar76 = 0x4ac0;
  do {
    pCVar75 = (ChVector<double> *)
              ((long)(this->beta).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
                     m_storage.m_data.array + lVar71);
    InterpDeriv(v,(ChMatrixNM<double,_4,_2> *)
                  ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                          _vptr_ChElementBase + lVar76),
                (ChVector<double> *)((long)this->y_i_2[0].m_data + lVar71),pCVar75);
    auVar108._8_8_ = 0;
    auVar108._0_8_ = pCVar75[-4].m_data[1];
    auVar169._8_8_ = 0;
    auVar169._0_8_ = *(ulong *)((long)this + lVar74 + -0x28);
    auVar152._8_8_ = pCVar75[-4].m_data[0];
    auVar152._0_8_ = pCVar75[-4].m_data[0];
    auVar163._8_8_ = pCVar75[-4].m_data[2];
    auVar163._0_8_ = pCVar75[-4].m_data[2];
    dVar3 = pCVar75->m_data[1];
    auVar124._8_8_ = 0;
    auVar124._0_8_ = dVar3;
    lVar76 = lVar76 + 0x40;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)((long)this + lVar74 + -0x30);
    auVar138._8_8_ = 0;
    auVar138._0_8_ = pCVar75[-4].m_data[1] * *(double *)((long)this + lVar74 + -0x18);
    auVar104 = vfmadd231sd_fma(auVar138,auVar152,auVar22);
    auVar56 = vunpcklpd_avx(auVar169,auVar108);
    auVar55 = vmovhpd_avx(auVar108,*(undefined8 *)((long)this + lVar74 + -0x20));
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         *(ulong *)((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                           _vptr_ChElementBase + lVar74);
    auVar104 = vfmadd231sd_fma(auVar104,auVar163,auVar23);
    auVar109._0_8_ = auVar56._0_8_ * auVar55._0_8_;
    auVar109._8_8_ = auVar56._8_8_ * auVar55._8_8_;
    auVar55 = vfmadd231pd_fma(auVar109,auVar152,*(undefined1 (*) [16])((long)this + lVar74 + -0x40))
    ;
    auVar55 = vfmadd231pd_fma(auVar55,auVar163,*(undefined1 (*) [16])((long)this + lVar74 + -0x10));
    *(undefined1 (*) [16])(pCVar75[-0x597].m_data + 1) = auVar55;
    pCVar75[-0x596].m_data[0] = auVar104._0_8_;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = *(ulong *)((long)this + lVar74 + -0x28);
    auVar139._8_8_ = pCVar75->m_data[0];
    auVar139._0_8_ = pCVar75->m_data[0];
    auVar153._8_8_ = pCVar75->m_data[2];
    auVar153._0_8_ = pCVar75->m_data[2];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)((long)this + lVar74 + -0x30);
    auVar110._8_8_ = 0;
    auVar110._0_8_ = dVar3 * *(double *)((long)this + lVar74 + -0x18);
    auVar55 = vfmadd231sd_fma(auVar110,auVar139,auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         *(ulong *)((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                           _vptr_ChElementBase + lVar74);
    auVar104 = vfmadd231sd_fma(auVar55,auVar153,auVar25);
    auVar56 = vunpcklpd_avx(auVar164,auVar124);
    auVar55 = vmovhpd_avx(auVar124,*(undefined8 *)((long)this + lVar74 + -0x20));
    auVar125._0_8_ = auVar56._0_8_ * auVar55._0_8_;
    auVar125._8_8_ = auVar56._8_8_ * auVar55._8_8_;
    auVar55 = vfmadd231pd_fma(auVar125,auVar139,*(undefined1 (*) [16])((long)this + lVar74 + -0x40))
    ;
    auVar55 = vfmadd231pd_fma(auVar55,auVar153,*(undefined1 (*) [16])((long)this + lVar74 + -0x10));
    *(undefined1 (*) [16])(pCVar75[-0x593].m_data + 1) = auVar55;
    pCVar75[-0x592].m_data[0] = auVar104._0_8_;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = pCVar75[-0x59f].m_data[2];
    auVar165._8_8_ = 0;
    auVar165._0_8_ = *(ulong *)((long)this + lVar74 + -0x28);
    auVar140._8_8_ = pCVar75[-0x59f].m_data[1];
    auVar140._0_8_ = pCVar75[-0x59f].m_data[1];
    auVar154._8_8_ = pCVar75[-0x59e].m_data[0];
    auVar154._0_8_ = pCVar75[-0x59e].m_data[0];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)((long)this + lVar74 + -0x30);
    auVar126._8_8_ = 0;
    auVar126._0_8_ = pCVar75[-0x59f].m_data[2] * *(double *)((long)this + lVar74 + -0x18);
    auVar104 = vfmadd231sd_fma(auVar126,auVar140,auVar26);
    auVar56 = vunpcklpd_avx(auVar165,auVar111);
    auVar55 = vmovhpd_avx(auVar111,*(undefined8 *)((long)this + lVar74 + -0x20));
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         *(ulong *)((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                           _vptr_ChElementBase + lVar74);
    auVar104 = vfmadd231sd_fma(auVar104,auVar154,auVar27);
    auVar112._0_8_ = auVar56._0_8_ * auVar55._0_8_;
    auVar112._8_8_ = auVar56._8_8_ * auVar55._8_8_;
    auVar55 = vfmadd231pd_fma(auVar112,auVar140,*(undefined1 (*) [16])((long)this + lVar74 + -0x40))
    ;
    auVar55 = vfmadd231pd_fma(auVar55,auVar154,*(undefined1 (*) [16])((long)this + lVar74 + -0x10));
    *(undefined1 (*) [16])(pCVar75[-0x577].m_data + 1) = auVar55;
    pCVar75[-0x576].m_data[0] = auVar104._0_8_;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = pCVar75[-0x59b].m_data[2];
    auVar166._8_8_ = 0;
    auVar166._0_8_ = *(ulong *)((long)this + lVar74 + -0x28);
    auVar141._8_8_ = pCVar75[-0x59b].m_data[1];
    auVar141._0_8_ = pCVar75[-0x59b].m_data[1];
    auVar155._8_8_ = pCVar75[-0x59a].m_data[0];
    auVar155._0_8_ = pCVar75[-0x59a].m_data[0];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)((long)this + lVar74 + -0x30);
    auVar127._8_8_ = 0;
    auVar127._0_8_ = pCVar75[-0x59b].m_data[2] * *(double *)((long)this + lVar74 + -0x18);
    auVar104 = vfmadd231sd_fma(auVar127,auVar141,auVar28);
    auVar56 = vunpcklpd_avx(auVar166,auVar113);
    auVar55 = vmovhpd_avx(auVar113,*(undefined8 *)((long)this + lVar74 + -0x20));
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         *(ulong *)((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                           _vptr_ChElementBase + lVar74);
    auVar104 = vfmadd231sd_fma(auVar104,auVar155,auVar29);
    auVar114._0_8_ = auVar56._0_8_ * auVar55._0_8_;
    auVar114._8_8_ = auVar56._8_8_ * auVar55._8_8_;
    auVar55 = vfmadd231pd_fma(auVar114,auVar141,*(undefined1 (*) [16])((long)this + lVar74 + -0x40))
    ;
    auVar55 = vfmadd231pd_fma(auVar55,auVar155,*(undefined1 (*) [16])((long)this + lVar74 + -0x10));
    lVar74 = lVar74 + 0x48;
    lVar71 = lVar71 + 0x18;
    *(undefined1 (*) [16])(pCVar75[-0x573].m_data + 1) = auVar55;
    pCVar75[-0x572].m_data[0] = auVar104._0_8_;
  } while (lVar71 != 0);
  lVar71 = 0;
  pCVar75 = this->eps_tilde_1_0_A;
  do {
    InterpDeriv_xi1(&local_8c0,v,pCVar75->m_data);
    InterpDeriv_xi2(&local_9c0,v,xi_02);
    auVar115._8_8_ = 0;
    auVar115._0_8_ = local_8c0.m_data[0];
    auVar156._8_8_ = 0;
    auVar156._0_8_ = local_8c0.m_data[2];
    der_mat = this->L_alpha_beta_A + lVar71;
    auVar30._8_8_ = 0;
    auVar30._0_8_ =
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar142._8_8_ = 0;
    auVar142._0_8_ =
         local_8c0.m_data[1] *
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar55 = vfmadd231sd_fma(auVar142,auVar115,auVar30);
    auVar31._8_8_ = 0;
    auVar31._0_8_ =
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar55 = vfmadd231sd_fma(auVar55,auVar156,auVar31);
    this->S_alpha_beta_A[lVar71].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[0] = auVar55._0_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar128._8_8_ = 0;
    auVar128._0_8_ =
         local_8c0.m_data[1] *
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar55 = vfmadd231sd_fma(auVar128,auVar115,auVar32);
    auVar33._8_8_ = 0;
    auVar33._0_8_ =
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar55 = vfmadd231sd_fma(auVar55,auVar156,auVar33);
    this->S_alpha_beta_A[lVar71].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[2] = auVar55._0_8_;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = local_9c0.m_data[0];
    auVar157._8_8_ = 0;
    auVar157._0_8_ = local_9c0.m_data[2];
    auVar34._8_8_ = 0;
    auVar34._0_8_ =
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar143._8_8_ = 0;
    auVar143._0_8_ =
         local_9c0.m_data[1] *
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar55 = vfmadd231sd_fma(auVar143,auVar116,auVar34);
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar55 = vfmadd231sd_fma(auVar55,auVar157,auVar35);
    this->S_alpha_beta_A[lVar71].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[1] = auVar55._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ =
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar129._8_8_ = 0;
    auVar129._0_8_ =
         local_9c0.m_data[1] *
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar55 = vfmadd231sd_fma(auVar129,auVar116,auVar36);
    auVar37._8_8_ = 0;
    auVar37._0_8_ =
         this->T_0_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar55 = vfmadd231sd_fma(auVar55,auVar157,auVar37);
    this->S_alpha_beta_A[lVar71].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[3] = auVar55._0_8_;
    local_720[0].m_data[2] = 0.0;
    local_720[0].m_data[0] = 0.0;
    local_720[0].m_data[1] = 0.0;
    local_a00.m_data[2] = 0.0;
    local_a00.m_data[0] = 0.0;
    local_a00.m_data[1] = 0.0;
    InterpDeriv(v,der_mat,local_720,&local_a00);
    auVar144._8_8_ = local_720[0].m_data[0];
    auVar144._0_8_ = local_720[0].m_data[0];
    auVar158._8_8_ = local_720[0].m_data[2];
    auVar158._0_8_ = local_720[0].m_data[2];
    pdVar73 = this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
              3;
    auVar117._0_8_ = local_720[0].m_data[1] * *pdVar73;
    auVar117._8_8_ = local_720[0].m_data[1] * pdVar73[1];
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar130._8_8_ = 0;
    auVar130._0_8_ =
         local_720[0].m_data[1] *
         this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar56 = vfmadd231sd_fma(auVar130,auVar144,auVar38);
    auVar55 = vfmadd231pd_fma(auVar117,auVar144,
                              *(undefined1 (*) [16])
                               this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar56 = vfmadd231sd_fma(auVar56,auVar158,auVar39);
    auVar55 = vfmadd231pd_fma(auVar55,auVar158,
                              *(undefined1 (*) [16])
                               (this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    *(undefined1 (*) [16])this->eps_tilde_1_0_A[lVar71].m_data = auVar55;
    this->eps_tilde_1_0_A[lVar71].m_data[2] = auVar56._0_8_;
    auVar145._8_8_ = local_a00.m_data[0];
    auVar145._0_8_ = local_a00.m_data[0];
    auVar159._8_8_ = local_a00.m_data[2];
    auVar159._0_8_ = local_a00.m_data[2];
    pdVar73 = this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
              3;
    auVar118._0_8_ = local_a00.m_data[1] * *pdVar73;
    auVar118._8_8_ = local_a00.m_data[1] * pdVar73[1];
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar131._8_8_ = 0;
    auVar131._0_8_ =
         local_a00.m_data[1] *
         this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar56 = vfmadd231sd_fma(auVar131,auVar145,auVar40);
    auVar55 = vfmadd231pd_fma(auVar118,auVar145,
                              *(undefined1 (*) [16])
                               this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array);
    auVar41._8_8_ = 0;
    auVar41._0_8_ =
         this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar56 = vfmadd231sd_fma(auVar56,auVar159,auVar41);
    auVar55 = vfmadd231pd_fma(auVar55,auVar159,
                              *(undefined1 (*) [16])
                               (this->T_A[lVar71].super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 6));
    *(undefined1 (*) [16])this->eps_tilde_2_0_A[lVar71].m_data = auVar55;
    this->eps_tilde_2_0_A[lVar71].m_data[2] = auVar56._0_8_;
    local_3c0.m_data[0] = (double)(this->S_alpha_beta_A + lVar71);
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_2,_2,_1,_2,_2>,_Eigen::Inverse<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_2,_2,_1,_2,_2> *)local_5c0,(SrcXprType *)&local_3c0,
          (assign_op<double,_double> *)&local_a20);
    lVar76 = 8;
    do {
      uVar103 = (**(code **)(&UNK_00b391d8 + lVar76))(&xi_A + lVar71 * 2);
      *(undefined8 *)(local_400 + lVar76 + 0x38) = uVar103;
      uVar103 = (**(code **)((long)&LI_J + lVar76))(&xi_A + lVar71 * 2);
      *(undefined8 *)((long)local_3c0.m_data + lVar76) = uVar103;
      lVar76 = lVar76 + 0x10;
    } while (lVar76 != 0x48);
    auVar56 = _local_5c0;
    auVar96._8_8_ = local_3c0.m_data[1];
    auVar96._0_8_ = local_3c0.m_data[0];
    auVar96._16_8_ = local_3c0.m_data[2];
    auVar96._24_40_ = auStack_3a8;
    auVar89 = vbroadcastf32x4_avx512f(auStack_5b8);
    lVar71 = lVar71 + 1;
    auVar55 = vmovhpd_avx(auVar56,dStack_5a8);
    auVar89 = vmulpd_avx512f(auVar96,auVar89);
    auVar88 = vshuff64x2_avx512f(ZEXT1664(auVar55),ZEXT1664(auVar55),0);
    auVar88 = vmulpd_avx512f(auVar96,auVar88);
    auVar89 = vshufpd_avx512f(auVar89,auVar89,0x55);
    auVar89 = vaddpd_avx512f(auVar89,auVar88);
    *(undefined1 (*) [64])
     (der_mat->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.array
         = auVar89;
    pCVar75 = extraout_RDX_00;
  } while (lVar71 != 4);
  lVar71 = 0x4bc0;
  local_3c0.m_data[0] = 0.0;
  local_3c0.m_data[1] = 0.0;
  local_3c0.m_data[2] = 0.0;
  auStack_5b8._8_8_ = 0.0;
  _local_5c0 = (double  [3])CONCAT816(auStack_5b8._8_8_,auVar56);
  _local_5c0 = ZEXT816(0);
  pdVar73 = this->eps_tilde_2_0_A[0].m_data + 2;
  pdVar77 = this->T_A[0].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8;
  do {
    InterpDeriv(v,(ChMatrixNM<double,_4,_2> *)
                  ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                          _vptr_ChElementBase + lVar71),&local_3c0,(ChVector<double> *)local_5c0);
    auVar146._8_8_ = local_3c0.m_data[0];
    auVar146._0_8_ = local_3c0.m_data[0];
    auVar160._8_8_ = local_3c0.m_data[2];
    auVar160._0_8_ = local_3c0.m_data[2];
    lVar71 = lVar71 + 0x40;
    auVar119._0_8_ = local_3c0.m_data[1] * pdVar77[-5];
    auVar119._8_8_ = local_3c0.m_data[1] * pdVar77[-4];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = pdVar77[-6];
    auVar132._8_8_ = 0;
    auVar132._0_8_ = local_3c0.m_data[1] * pdVar77[-3];
    auVar56 = vfmadd231sd_fma(auVar132,auVar146,auVar42);
    auVar55 = vfmadd231pd_fma(auVar119,auVar146,
                              *(undefined1 (*) [16])
                               ((plain_array<double,_9,_1,_0> *)(pdVar77 + -8))->array);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = *pdVar77;
    auVar56 = vfmadd231sd_fma(auVar56,auVar160,auVar43);
    auVar55 = vfmadd231pd_fma(auVar55,auVar160,*(undefined1 (*) [16])(pdVar77 + -2));
    *(undefined1 (*) [16])(pdVar73 + -0xe) = auVar55;
    pdVar73[-0xc] = (double)auVar56._0_8_;
    auVar147._8_8_ = local_5c0;
    auVar147._0_8_ = local_5c0;
    auVar161._8_8_ = auStack_5b8._8_8_;
    auVar161._0_8_ = auStack_5b8._8_8_;
    auVar120._0_8_ = (double)auStack_5b8._0_8_ * pdVar77[-5];
    auVar120._8_8_ = (double)auStack_5b8._0_8_ * pdVar77[-4];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = pdVar77[-6];
    auVar133._8_8_ = 0;
    auVar133._0_8_ = (double)auStack_5b8._0_8_ * pdVar77[-3];
    auVar56 = vfmadd231sd_fma(auVar133,auVar147,auVar44);
    auVar55 = vfmadd231pd_fma(auVar120,auVar147,
                              *(undefined1 (*) [16])
                               ((plain_array<double,_9,_1,_0> *)(pdVar77 + -8))->array);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = *pdVar77;
    auVar56 = vfmadd231sd_fma(auVar56,auVar161,auVar45);
    auVar55 = vfmadd231pd_fma(auVar55,auVar161,*(undefined1 (*) [16])(pdVar77 + -2));
    pdVar77 = pdVar77 + 9;
    *(undefined1 (*) [16])((ChVector<double> *)(pdVar73 + -2))->m_data = auVar55;
    *pdVar73 = auVar56._0_8_;
    pdVar73 = pdVar73 + 3;
  } while (lVar71 != 0x4cc0);
  psVar46 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar47 = (psVar46->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  p_Var48 = (psVar46->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (p_Var48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var48->_M_use_count = p_Var48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var48->_M_use_count = p_Var48->_M_use_count + 1;
    }
  }
  psVar46 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar49 = psVar46[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var50 = psVar46[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var50->_M_use_count = p_Var50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var50->_M_use_count = p_Var50->_M_use_count + 1;
    }
  }
  dVar3 = *(double *)((long)&peVar47->super_ChNodeFEAbase + 0x20);
  dVar4 = *(double *)&peVar47->field_0x28;
  dVar5 = *(double *)&peVar47->field_0x30;
  psVar46 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  dVar6 = *(double *)((long)&peVar49->super_ChNodeFEAbase + 0x20);
  dVar7 = *(double *)&peVar49->field_0x28;
  dVar8 = *(double *)&peVar49->field_0x30;
  peVar47 = psVar46[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var51 = psVar46[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
    }
  }
  psVar46 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar49 = psVar46[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var52 = psVar46[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var52 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var52->_M_use_count = p_Var52->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var52->_M_use_count = p_Var52->_M_use_count + 1;
    }
  }
  dVar4 = (dVar4 + dVar7) * 0.5 -
          (*(double *)&peVar47->field_0x28 + *(double *)&peVar49->field_0x28) * 0.5;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = dVar4 * dVar4;
  auVar148._8_8_ = 0;
  auVar148._0_8_ =
       (dVar3 + dVar6) * 0.5 -
       (*(double *)((long)&peVar47->super_ChNodeFEAbase + 0x20) +
       *(double *)((long)&peVar49->super_ChNodeFEAbase + 0x20)) * 0.5;
  auVar55 = vfmadd231sd_fma(auVar134,auVar148,auVar148);
  auVar121._8_8_ = 0;
  auVar121._0_8_ =
       (dVar5 + dVar8) * 0.5 -
       (*(double *)&peVar47->field_0x30 + *(double *)&peVar49->field_0x30) * 0.5;
  auVar55 = vfmadd231sd_fma(auVar55,auVar121,auVar121);
  auVar55 = vsqrtsd_avx(auVar55,auVar55);
  this->m_lenX = auVar55._0_8_;
  if (p_Var52 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var52);
  }
  if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
  }
  if (p_Var50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var50);
  }
  if (p_Var48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var48);
  }
  psVar46 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar47 = (psVar46->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  p_Var48 = (psVar46->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (p_Var48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var48->_M_use_count = p_Var48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var48->_M_use_count = p_Var48->_M_use_count + 1;
    }
  }
  psVar46 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar49 = psVar46[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var50 = psVar46[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var50->_M_use_count = p_Var50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var50->_M_use_count = p_Var50->_M_use_count + 1;
    }
  }
  dVar3 = *(double *)((long)&peVar47->super_ChNodeFEAbase + 0x20);
  dVar4 = *(double *)&peVar47->field_0x28;
  dVar5 = *(double *)&peVar47->field_0x30;
  psVar46 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  dVar6 = *(double *)((long)&peVar49->super_ChNodeFEAbase + 0x20);
  dVar7 = *(double *)&peVar49->field_0x28;
  dVar8 = *(double *)&peVar49->field_0x30;
  peVar47 = psVar46[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var51 = psVar46[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var51->_M_use_count = p_Var51->_M_use_count + 1;
    }
  }
  psVar46 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar49 = psVar46[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var52 = psVar46[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var52 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var52->_M_use_count = p_Var52->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var52->_M_use_count = p_Var52->_M_use_count + 1;
    }
  }
  dVar4 = (dVar4 + dVar7) * 0.5 -
          (*(double *)&peVar47->field_0x28 + *(double *)&peVar49->field_0x28) * 0.5;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar4 * dVar4;
  auVar149._8_8_ = 0;
  auVar149._0_8_ =
       (dVar3 + dVar6) * 0.5 -
       (*(double *)((long)&peVar47->super_ChNodeFEAbase + 0x20) +
       *(double *)((long)&peVar49->super_ChNodeFEAbase + 0x20)) * 0.5;
  auVar55 = vfmadd231sd_fma(auVar135,auVar149,auVar149);
  auVar122._8_8_ = 0;
  auVar122._0_8_ =
       (dVar5 + dVar8) * 0.5 -
       (*(double *)&peVar47->field_0x30 + *(double *)&peVar49->field_0x30) * 0.5;
  auVar55 = vfmadd231sd_fma(auVar55,auVar122,auVar122);
  auVar55 = vsqrtsd_avx(auVar55,auVar55);
  this->m_lenY = auVar55._0_8_;
  if (p_Var52 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var52);
  }
  if (p_Var51 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var51);
  }
  if (p_Var50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var50);
  }
  if (p_Var48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var48);
  }
  ComputeMassMatrix(this);
  return;
}

Assistant:

void ChElementShellReissner4::SetupInitial(ChSystem* system) {
    // Align initial pos/rot of nodes to actual pos/rot
    SetAsNeutral();

    ComputeInitialNodeOrientation();
    // 	UpdateNodalAndAveragePosAndOrientation();
    // 	InterpolateOrientation();
    // copy ref values
    T0_overline = T_overline;
    T_0_0 = T_0;
    for (int i = 0; i < NUMNODES; i++) {
        xa_0[i] = xa[i];
    }
    for (int i = 0; i < NUMIP; i++) {
        T_0_i[i] = T_i[i];
    }
    for (int i = 0; i < NUMSSEP; i++) {
        T_0_A[i] = T_A[i];
    }

    ChMatrixNM<double, 4, 4> M_0;
    ChMatrixNM<double, 4, 4> M_0_Inv;
    {
        ChVector<> x_1 = InterpDeriv_xi1(xa, xi_0);
        ChVector<> x_2 = InterpDeriv_xi2(xa, xi_0);
        S_alpha_beta_0(0, 0) = T_0_0.Get_A_Xaxis() ^ x_1;
        S_alpha_beta_0(1, 0) = T_0_0.Get_A_Yaxis() ^ x_1;
        S_alpha_beta_0(0, 1) = T_0_0.Get_A_Xaxis() ^ x_2;
        S_alpha_beta_0(1, 1) = T_0_0.Get_A_Yaxis() ^ x_2;
        alpha_0 = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 1) - S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 0);

        M_0(0, 0) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(0, 0);
        M_0(0, 1) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(0, 1);
        M_0(0, 2) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(0, 0);
        M_0(0, 3) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(0, 1);

        M_0(1, 0) = S_alpha_beta_0(1, 0) * S_alpha_beta_0(1, 0);
        M_0(1, 1) = S_alpha_beta_0(1, 1) * S_alpha_beta_0(1, 1);
        M_0(1, 2) = S_alpha_beta_0(1, 1) * S_alpha_beta_0(1, 0);
        M_0(1, 3) = S_alpha_beta_0(1, 0) * S_alpha_beta_0(1, 1);

        M_0(2, 0) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 0);
        M_0(2, 1) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 1);
        M_0(2, 2) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 1);
        M_0(2, 3) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 0);

        M_0(3, 0) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 0);
        M_0(3, 1) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 1);
        M_0(3, 2) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 0);
        M_0(3, 3) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 1);

        M_0_Inv = M_0.inverse();
    }

    for (int i = 0; i < NUMIP; i++) {
        ChMatrixNM<double, 4, 2> L_alpha_B_i;
        ChVector<> x_1 = InterpDeriv_xi1(xa, xi_i[i]);
        ChVector<> x_2 = InterpDeriv_xi2(xa, xi_i[i]);
        S_alpha_beta_i[i](0, 0) = T_0_i[i].Get_A_Xaxis() ^ x_1;
        S_alpha_beta_i[i](1, 0) = T_0_i[i].Get_A_Yaxis() ^ x_1;
        S_alpha_beta_i[i](0, 1) = T_0_i[i].Get_A_Xaxis() ^ x_2;
        S_alpha_beta_i[i](1, 1) = T_0_i[i].Get_A_Yaxis() ^ x_2;
        // alpha_i = det(S_alpha_beta_i)
        alpha_i[i] =
            S_alpha_beta_i[i](0, 0) * S_alpha_beta_i[i](1, 1) - S_alpha_beta_i[i](0, 1) * S_alpha_beta_i[i](1, 0);

        ChMatrixNM<double, 2, 2> xi_i_i;
        xi_i_i = S_alpha_beta_i[i].inverse();

        for (int n = 0; n < NUMNODES; n++) {
            for (int ii = 0; ii < 2; ii++) {
                L_alpha_B_i(n, ii) = LI_J[n][ii](xi_i[i]);
            }
        }

        L_alpha_beta_i[i] = L_alpha_B_i * xi_i_i;

        double t = xi_i[i][0] * xi_i[i][1];
        ChMatrixNM<double, 4, IDOFS> H;
        H.setZero();

        H(0, 0) = xi_i[i][0];
        H(0, 1) = t;

        H(1, 2) = xi_i[i][1];
        H(1, 3) = t;

        H(2, 4) = xi_i[i][0];
        H(2, 5) = t;

        H(3, 6) = xi_i[i][1];
        H(3, 5) = t;

        ChMatrixNM<double, 12, 4> Perm;
        Perm.setZero();

        // 1, 5, 4, 2, 3, 6
        Perm(0, 0) = 1.;
        Perm(1, 2) = 1.;
        Perm(3, 3) = 1.;
        Perm(4, 1) = 1.;

        ChMatrixNM<double, 4, IDOFS> tmpP = M_0_Inv.transpose() * H;

        P_i[i] = (alpha_0 / alpha_i[i]) * Perm * tmpP;
    }
    // save initial axial values
    ComputeIPCurvature();
    for (int i = 0; i < NUMIP; i++) {
        InterpDeriv(xa, L_alpha_beta_i[i], y_i_1[i], y_i_2[i]);
        eps_tilde_1_0_i[i] = T_i[i].transpose() * y_i_1[i];
        eps_tilde_2_0_i[i] = T_i[i].transpose() * y_i_2[i];
        k_tilde_1_0_i[i] = T_i[i].transpose() * k_1_i[i];
        k_tilde_2_0_i[i] = T_i[i].transpose() * k_2_i[i];
    }
    for (int i = 0; i < NUMSSEP; i++) {
        ChMatrixNM<double, 4, 2> L_alpha_B_A;
        ChVector<> x_1 = InterpDeriv_xi1(xa, xi_A[i]);
        ChVector<> x_2 = InterpDeriv_xi2(xa, xi_A[i]);
        S_alpha_beta_A[i](0, 0) = T_0_A[i].Get_A_Xaxis() ^ x_1;
        S_alpha_beta_A[i](1, 0) = T_0_A[i].Get_A_Yaxis() ^ x_1;
        S_alpha_beta_A[i](0, 1) = T_0_A[i].Get_A_Xaxis() ^ x_2;
        S_alpha_beta_A[i](1, 1) = T_0_A[i].Get_A_Yaxis() ^ x_2;

        ChVector<> y_A_1;
        ChVector<> y_A_2;
        InterpDeriv(xa, L_alpha_beta_A[i], y_A_1, y_A_2);
        eps_tilde_1_0_A[i] = T_A[i].transpose() * y_A_1;
        eps_tilde_2_0_A[i] = T_A[i].transpose() * y_A_2;

        // xi_A_i = S_alpha_beta_A^{-1}
        ChMatrixNM<double, 2, 2> xi_A_i;
        xi_A_i = S_alpha_beta_A[i].inverse();

        for (int n = 0; n < NUMNODES; n++) {
            for (int ii = 0; ii < 2; ii++) {
                L_alpha_B_A(n, ii) = LI_J[n][ii](xi_A[i]);
            }
        }

        L_alpha_beta_A[i] = L_alpha_B_A * xi_A_i;
    }
    {
        ChVector<> y_A_1;
        ChVector<> y_A_2;
        for (int i = 0; i < NUMSSEP; i++) {
            InterpDeriv(xa, L_alpha_beta_A[i], y_A_1, y_A_2);
            eps_tilde_1_0_A[i] = T_A[i].transpose() * y_A_1;
            eps_tilde_2_0_A[i] = T_A[i].transpose() * y_A_2;
        }
    }

    // Perform layer initialization
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers[kl].SetupInitial();
    }

    // compute initial sizes (just for auxiliary information)
    m_lenX =
        (0.5 * (GetNodeA()->coord.pos + GetNodeD()->coord.pos) - 0.5 * (GetNodeB()->coord.pos + GetNodeC()->coord.pos))
            .Length();
    m_lenY =
        (0.5 * (GetNodeA()->coord.pos + GetNodeB()->coord.pos) - 0.5 * (GetNodeD()->coord.pos + GetNodeC()->coord.pos))
            .Length();

    // Compute mass matrix
    ComputeMassMatrix();
}